

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_timer.c
# Opt level: O2

void test_close_without_hook(void)

{
  cio_error cVar1;
  cio_timer timer;
  
  timerfd_create_fake.return_val = 5;
  cVar1 = cio_timer_init(&timer,(cio_eventloop *)0x0,(cio_timer_close_hook_t)0x0);
  UnityAssertEqualNumber(0,(long)cVar1,(char *)0x0,0xd7,UNITY_DISPLAY_STYLE_INT);
  cio_timer_close(&timer);
  UnityAssertEqualNumber(1,(ulong)close_fake.call_count,(char *)0x0,0xda,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber(5,(long)close_fake.arg0_val,(char *)0x0,0xdb,UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_close_without_hook(void)
{
	static const int timerfd = 5;
	timerfd_create_fake.return_val = timerfd;

	struct cio_timer timer;
	enum cio_error err = cio_timer_init(&timer, NULL, NULL);
	TEST_ASSERT_EQUAL(CIO_SUCCESS, err);

	cio_timer_close(&timer);
	TEST_ASSERT_EQUAL(1, close_fake.call_count);
	TEST_ASSERT_EQUAL(timerfd, close_fake.arg0_val);
}